

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QCss::ImportRule>::moveAppend
          (QGenericArrayOps<QCss::ImportRule> *this,ImportRule *b,ImportRule *e)

{
  ImportRule *pIVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  Data *pDVar5;
  QString *pQVar6;
  qsizetype qVar7;
  
  if ((b != e) && (b < e)) {
    pIVar1 = (this->super_QArrayDataPointer<QCss::ImportRule>).ptr;
    qVar7 = (this->super_QArrayDataPointer<QCss::ImportRule>).size;
    do {
      pDVar2 = (b->href).d.d;
      (b->href).d.d = (Data *)0x0;
      pIVar1[qVar7].href.d.d = pDVar2;
      pcVar3 = (b->href).d.ptr;
      (b->href).d.ptr = (char16_t *)0x0;
      pIVar1[qVar7].href.d.ptr = pcVar3;
      qVar4 = (b->href).d.size;
      (b->href).d.size = 0;
      pIVar1[qVar7].href.d.size = qVar4;
      pDVar5 = (b->media).d.d;
      (b->media).d.d = (Data *)0x0;
      pIVar1[qVar7].media.d.d = pDVar5;
      pQVar6 = (b->media).d.ptr;
      (b->media).d.ptr = (QString *)0x0;
      pIVar1[qVar7].media.d.ptr = pQVar6;
      qVar4 = (b->media).d.size;
      (b->media).d.size = 0;
      pIVar1[qVar7].media.d.size = qVar4;
      b = b + 1;
      qVar7 = (this->super_QArrayDataPointer<QCss::ImportRule>).size + 1;
      (this->super_QArrayDataPointer<QCss::ImportRule>).size = qVar7;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }